

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_direct.c
# Opt level: O2

void SUNDlsMat_SetToZero(SUNDlsMat A)

{
  sunrealtype *psVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  
  if (A->type == 2) {
    lVar3 = A->mu;
    lVar5 = A->ml;
    lVar6 = 0;
    lVar4 = A->M;
    if (A->M < 1) {
      lVar4 = lVar6;
    }
    for (; lVar6 != lVar4; lVar6 = lVar6 + 1) {
      lVar2 = A->s_mu;
      psVar1 = A->cols[lVar6];
      for (lVar7 = 0; lVar7 <= lVar5 + lVar3; lVar7 = lVar7 + 1) {
        psVar1[lVar2 + (lVar7 - lVar3)] = 0.0;
      }
    }
  }
  else if (A->type == 1) {
    lVar3 = A->N;
    if (A->N < 1) {
      lVar3 = 0;
    }
    for (lVar5 = 0; lVar5 != lVar3; lVar5 = lVar5 + 1) {
      psVar1 = A->cols[lVar5];
      lVar4 = A->M;
      if (A->M < 1) {
        lVar4 = 0;
      }
      for (lVar6 = 0; lVar4 != lVar6; lVar6 = lVar6 + 1) {
        psVar1[lVar6] = 0.0;
      }
    }
  }
  return;
}

Assistant:

void SUNDlsMat_SetToZero(SUNDlsMat A)
{
  sunindextype i, j, colSize;
  sunrealtype* col_j;

  switch (A->type)
  {
  case SUNDIALS_DENSE:

    for (j = 0; j < A->N; j++)
    {
      col_j = A->cols[j];
      for (i = 0; i < A->M; i++) { col_j[i] = ZERO; }
    }

    break;

  case SUNDIALS_BAND:

    colSize = A->mu + A->ml + 1;
    for (j = 0; j < A->M; j++)
    {
      col_j = A->cols[j] + A->s_mu - A->mu;
      for (i = 0; i < colSize; i++) { col_j[i] = ZERO; }
    }

    break;
  }
}